

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.h
# Opt level: O1

void __thiscall cfd::UtxoData::~UtxoData(UtxoData *this)

{
  core::Script::~Script((Script *)(this + 0x4b8));
  *(undefined ***)(this + 0x490) = &PTR__ConfidentialValue_002e2250;
  if (*(void **)(this + 0x498) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x498));
  }
  *(undefined ***)(this + 0x470) = &PTR__BlindFactor_002e1f10;
  if (*(void **)(this + 0x478) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x478));
  }
  *(undefined ***)(this + 0x450) = &PTR__BlindFactor_002e1f10;
  if (*(void **)(this + 0x458) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x458));
  }
  core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(this + 0x2a0));
  *(undefined ***)(this + 0x278) = &PTR__ConfidentialAssetId_002e2170;
  if (*(void **)(this + 0x280) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x280));
  }
  if (*(UtxoData **)(this + 0x238) != this + 0x248) {
    operator_delete(*(UtxoData **)(this + 0x238));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(this + 0x208));
  core::Script::~Script((Script *)(this + 0x1c8));
  *(code **)(this + 0x138) = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (this + 0x1b0));
  core::TapBranch::~TapBranch((TapBranch *)(this + 0x138));
  if (*(void **)(this + 0x120) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x120));
  }
  if (*(void **)(this + 0x108) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x108));
  }
  if (*(void **)(this + 0xf0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xf0));
  }
  if (*(UtxoData **)(this + 0xd0) != this + 0xe0) {
    operator_delete(*(UtxoData **)(this + 0xd0));
  }
  core::Script::~Script((Script *)(this + 0x88));
  core::Script::~Script((Script *)(this + 0x50));
  *(undefined ***)(this + 0x28) = &PTR__Txid_002e1e60;
  if (*(void **)(this + 0x30) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x30));
  }
  *(undefined ***)(this + 8) = &PTR__BlockHash_002e21a0;
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x10));
    return;
  }
  return;
}

Assistant:

struct CFD_EXPORT UtxoData {
 public:
  uint64_t block_height = 0;  //!< blick height
  BlockHash block_hash;       //!< block hash
  Txid txid;                  //!< txid
  uint32_t vout = 0;          //!< vout
  Script locking_script;      //!< locking script
  Script redeem_script;       //!< script
  Address address;            //!< address
  std::string descriptor;     //!< output descriptor
  Amount amount;              //!< amount
  //! address type
  AddressType address_type = AddressType::kP2shAddress;
  //! binary data option
  void* binary_data = nullptr;
#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset;  //!< asset
  // elements
  ElementsConfidentialAddress confidential_address;  //!< Confidential address
  BlindFactor asset_blind_factor;                    //!< asset blind factor
  BlindFactor amount_blind_factor;                   //!< blind vactor
  ConfidentialValue value_commitment;                //!< value commitment
#endif                                               // CFD_DISABLE_ELEMENTS
  Script scriptsig_template;                         //!< scriptsig template

 public:
  /**
   * @brief constructor.
   */
  UtxoData();
#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] asset    asset
   * @param[in] confidential_address    confidential_address
   * @param[in] asset_blind_factor    asset_blind_factor
   * @param[in] amount_blind_factor    amount_blind_factor
   * @param[in] value_commitment    value_commitment
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const ConfidentialAssetId& asset,
      const ElementsConfidentialAddress& confidential_address,
      const BlindFactor& asset_blind_factor,
      const BlindFactor& amount_blind_factor,
      const ConfidentialValue& value_commitment,
      const Script& scriptsig_template);
#else
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const Script& scriptsig_template);
#endif  // CFD_DISABLE_ELEMENTS
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  UtxoData(const UtxoData& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  UtxoData& operator=(const UtxoData& object) &;
}